

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O0

void __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>
::
parallelCalculateFitness<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>>
          (Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>
           *this,__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                 first,
          __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
          last,UserData *data)

{
  ulong uVar1;
  size_t sVar2;
  __basic_future<void> *this_00;
  void *__stat_loc;
  uint local_dc;
  uint i_1;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_c8;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [40];
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  blockEnd;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  _Stack_80;
  uint i;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  blockStart;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  size_t blockSize;
  size_t numThreads;
  difference_type length;
  UserData *data_local;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *this_local;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  last_local;
  __normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  first_local;
  
  uVar1 = std::
          distance<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>>
                    (first,last);
  if ((long)uVar1 < (long)(ulong)*(uint *)(this + 0xf0)) {
    Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
    ::calculateFitnessBlock
              ((Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                *)this,(iterator)first._M_current,(iterator)last._M_current,data);
  }
  sVar2 = ThreadPool::getNumThreads((ThreadPool *)(this + 0x20));
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&blockStart);
  _Stack_80._M_current = first._M_current;
  for (blockEnd._M_current._4_4_ = 0; (ulong)blockEnd._M_current._4_4_ < sVar2 - 1;
      blockEnd._M_current._4_4_ = blockEnd._M_current._4_4_ + 1) {
    local_b0._32_8_ = _Stack_80._M_current;
    std::
    advance<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,unsigned_long>
              ((__normal_iterator<crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                *)(local_b0 + 0x20),uVar1 / sVar2);
    local_c0 = (Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                *)Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                  ::calculateFitnessBlock;
    local_b8 = 0;
    local_c8._M_current = (Chromosome<Gen,_ComputeFitness> *)this;
    ThreadPool::
    enqueue<void(crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>::*)(__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,crsGA::UserData_const*),crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>*,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>&,__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>&,crsGA::UserData_const*&>
              ((ThreadPool *)local_b0,
               (offset_in_Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_to_subr
                *)(this + 0x20),&local_c0,&local_c8,&stack0xffffffffffffff80,
               (UserData **)(local_b0 + 0x20));
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&blockStart,
               (future<void> *)local_b0);
    std::future<void>::~future((future<void> *)local_b0);
    _Stack_80._M_current = (Chromosome<Gen,_ComputeFitness> *)local_b0._32_8_;
  }
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::calculateFitnessBlock
            ((Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
              *)this,(iterator)_Stack_80._M_current,(iterator)last._M_current,data);
  for (local_dc = 0; (ulong)local_dc < sVar2 - 1; local_dc = local_dc + 1) {
    __stat_loc = (void *)(ulong)local_dc;
    this_00 = &std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::operator[]
                         ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                          &blockStart,(size_type)__stat_loc)->super___basic_future<void>;
    std::__basic_future<void>::wait(this_00,__stat_loc);
  }
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&blockStart);
  return;
}

Assistant:

void parallelCalculateFitness(Iterator first, Iterator last, const UserData *data)
    {
        auto length = std::distance(first, last);
        if (length < _minPerThread)
            calculateFitnessBlock(first, last, data);
        const auto numThreads = _threadPool.getNumThreads();
        const size_t blockSize = length / numThreads;

        std::vector<std::future<void>> futures;
        Iterator blockStart = first;
        for (auto i = 0u; i < (numThreads - 1); ++i)
        {
            Iterator blockEnd = blockStart;
            std::advance(blockEnd, blockSize);
            futures.emplace_back(_threadPool.enqueue(&Population::calculateFitnessBlock, this, blockStart, blockEnd, data));
            blockStart = blockEnd;
        }
        calculateFitnessBlock(blockStart, last, data);
        for (auto i = 0u; i < (numThreads - 1); ++i)
        {
            futures[i].wait();
        }
    }